

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void extend_lines(uint8_t *buf,int width,int height,int stride,int extend,int use_highbitdepth)

{
  int iVar1;
  undefined1 auVar2 [16];
  
  iVar1 = 1;
  do {
    if (stride == 0) {
      *(uint *)((long)buf + -4) = (uint)(byte)*(ushort *)buf * 0x1010101;
      *(uint *)((long)buf + (long)width) =
           (uint)*(byte *)((long)buf + (long)(width + -1)) * 0x1010101;
    }
    else {
      auVar2 = pshuflw(ZEXT216(*(ushort *)buf),ZEXT216(*(ushort *)buf),0);
      *(long *)((long)buf + -8) = auVar2._0_8_;
      auVar2 = pshuflw(ZEXT216(*(ushort *)((long)buf + (long)(width + -1) * 2)),
                       ZEXT216(*(ushort *)((long)buf + (long)(width + -1) * 2)),0);
      *(long *)((long)buf + (long)width * 2) = auVar2._0_8_;
    }
    buf = (uint8_t *)((long)buf + (long)height);
    iVar1 = iVar1 + -1;
  } while (iVar1 == 0);
  return;
}

Assistant:

static void extend_lines(uint8_t *buf, int width, int height, int stride,
                         int extend, int use_highbitdepth) {
  for (int i = 0; i < height; ++i) {
    if (use_highbitdepth) {
      uint16_t *buf16 = (uint16_t *)buf;
      aom_memset16(buf16 - extend, buf16[0], extend);
      aom_memset16(buf16 + width, buf16[width - 1], extend);
    } else {
      memset(buf - extend, buf[0], extend);
      memset(buf + width, buf[width - 1], extend);
    }
    buf += stride;
  }
}